

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

FloatMixTexture *
pbrt::FloatMixTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  FloatMixTexture *pFVar1;
  undefined8 in_RCX;
  Allocator in_RSI;
  undefined8 in_stack_ffffffffffffff00;
  Float defaultValue;
  FloatTextureHandle *args_1;
  string *in_stack_ffffffffffffff08;
  string *name;
  TextureParameterDictionary *in_stack_ffffffffffffff10;
  TextureParameterDictionary *this;
  allocator<char> *__a;
  char *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff30;
  string local_c8 [40];
  undefined8 local_a0;
  undefined1 local_91 [41];
  undefined8 local_68;
  allocator<char> local_49;
  string local_48 [48];
  string *local_18;
  undefined8 local_8;
  
  defaultValue = (Float)((ulong)in_stack_ffffffffffffff00 >> 0x20);
  __a = &local_49;
  local_18 = (string *)in_RSI.memoryResource;
  local_8 = in_RCX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,__a);
  local_68 = local_8;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,defaultValue,in_RSI);
  this = (TextureParameterDictionary *)local_91;
  name = local_18;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,__a);
  local_a0 = local_8;
  TextureParameterDictionary::GetFloatTexture(this,name,defaultValue,in_RSI);
  args_1 = (FloatTextureHandle *)&stack0xffffffffffffff37;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,__a);
  TextureParameterDictionary::GetFloatTexture(this,name,(Float)((ulong)args_1 >> 0x20),in_RSI);
  pFVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::FloatMixTexture,pbrt::FloatTextureHandle,pbrt::FloatTextureHandle,pbrt::FloatTextureHandle>
                     ((polymorphic_allocator<std::byte> *)this,(FloatTextureHandle *)name,args_1,
                      (FloatTextureHandle *)local_18);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff37);
  std::__cxx11::string::~string((string *)(local_91 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_91);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  return pFVar1;
}

Assistant:

FloatMixTexture *FloatMixTexture::Create(const Transform &renderFromTexture,
                                         const TextureParameterDictionary &parameters,
                                         const FileLoc *loc, Allocator alloc) {
    return alloc.new_object<FloatMixTexture>(
        parameters.GetFloatTexture("tex1", 0.f, alloc),
        parameters.GetFloatTexture("tex2", 1.f, alloc),
        parameters.GetFloatTexture("amount", 0.5f, alloc));
}